

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

void __thiscall
ON_3dmRenderSettings::ON_3dmRenderSettings(ON_3dmRenderSettings *this,ON_3dmRenderSettings *rs)

{
  ON_Object::ON_Object(&this->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_0081af68;
  this->m_rendering_source = ActiveViewport;
  ON_wString::ON_wString(&this->m_specific_viewport);
  ON_wString::ON_wString(&this->m_named_view);
  ON_wString::ON_wString(&this->m_snapshot);
  this->m_reserved1 = 0;
  this->m_bForceViewportAspectRatio = false;
  this->m_bCustomImageSize = false;
  this->m_image_width = 800;
  this->m_image_height = 600;
  this->m_reserved3 = 0;
  this->m_image_dpi = 72.0;
  this->m_image_us = Inches;
  (this->m_ambient_light).field_0 = ON_Color::Black.field_0;
  this->m_background_style = 0;
  (this->m_background_color).field_0 = ON_Color::White.field_0;
  (this->m_background_bottom_color).field_0 = ON_Color::Gray160.field_0;
  ON_wString::ON_wString(&this->m_background_bitmap_filename);
  (this->m_embedded_image_file_id).Data1 = 0;
  (this->m_embedded_image_file_id).Data2 = 0;
  (this->m_embedded_image_file_id).Data3 = 0;
  (this->m_embedded_image_file_id).Data4[0] = '\0';
  (this->m_embedded_image_file_id).Data4[1] = '\0';
  (this->m_embedded_image_file_id).Data4[2] = '\0';
  (this->m_embedded_image_file_id).Data4[3] = '\0';
  (this->m_embedded_image_file_id).Data4[4] = '\0';
  (this->m_embedded_image_file_id).Data4[5] = '\0';
  (this->m_embedded_image_file_id).Data4[6] = '\0';
  (this->m_embedded_image_file_id).Data4[7] = '\0';
  this->m_bUseHiddenLights = false;
  this->m_bDepthCue = false;
  this->m_bFlatShade = false;
  this->m_bRenderBackfaces = true;
  this->m_bRenderPoints = false;
  this->m_bRenderCurves = false;
  this->m_bRenderIsoparams = false;
  this->m_bRenderMeshEdges = false;
  this->m_bRenderAnnotation = false;
  this->m_bScaleBackgroundToFit = false;
  this->m_bTransparentBackground = false;
  this->m_reserved4 = '\0';
  this->m_reserved5 = 0;
  this->m_antialias_style = 1;
  this->m_shadowmap_style = 1;
  this->m_shadowmap_width = 1000;
  this->m_shadowmap_height = 1000;
  this->m_shadowmap_offset = 0.75;
  this->m_bUsesAmbientAttr = true;
  this->m_bUsesBackgroundAttr = true;
  this->m_bUsesBackfaceAttr = false;
  this->m_bUsesPointsAttr = false;
  this->m_bUsesCurvesAttr = true;
  this->m_bUsesIsoparmsAttr = true;
  this->m_bUsesMeshEdgesAttr = false;
  this->m_bUsesAnnotationAttr = true;
  this->m_bUsesHiddenLightsAttr = true;
  this->m_reserved6 = '\0';
  this->m_reserved7 = 0;
  this->m_reserved8 = 0;
  this->m_private = (ON_3dmRenderSettingsPrivate *)0x0;
  operator=(this,rs);
  return;
}

Assistant:

ON_3dmRenderSettings::ON_3dmRenderSettings(const ON_3dmRenderSettings& rs)
{
  operator = (rs);
}